

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_boundary_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,false>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  pointer pvVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  __hash_code __code;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_false>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_1f0;
  undefined1 local_1d8 [8];
  undefined8 local_1d0;
  shared_count sStack_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  _Base_ptr local_1a8;
  _Base_ptr local_1a0;
  _Base_ptr local_198;
  char *local_190;
  char *local_188;
  undefined **local_180;
  undefined1 local_178;
  _Base_ptr local_170;
  _Base_ptr local_168;
  undefined1 local_150 [64];
  __buckets_ptr local_110;
  ulong local_108;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,false>>>>
            ();
  local_150._0_8_ = operator_new(0x38);
  (((Column_settings *)local_150._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((Column_settings *)local_150._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  (((Column_settings *)local_150._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  (((Column_settings *)local_150._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
  (((Column_settings *)local_150._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  (((Column_settings *)local_150._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  (((Column_settings *)local_150._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,false>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,false>>>
              *)(local_150 + 8),&local_1f0,(Column_settings *)local_150._0_8_);
  if (local_1f0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1f0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      pvVar3 = local_1f0.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (uint)uVar6;
      if (uVar5 == 5) {
        local_190 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_188 = "";
        local_1a0 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
        local_198 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x255,
                   &local_1a0);
        if (local_110[uVar6 % local_108] == (__node_base_ptr)0x0) {
LAB_0019d8de:
          std::__throw_out_of_range("_Map_base::at");
        }
        p_Var2 = local_110[uVar6 % local_108]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        while (uVar1 != 5) {
          p_Var2 = p_Var2->_M_nxt;
          if ((p_Var2 == (_Hash_node_base *)0x0) ||
             (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_108 != uVar6 % local_108))
          goto LAB_0019d8de;
        }
        local_1d8[0] = p_Var2[7]._M_nxt == p_Var2 + 7 || p_Var2[7]._M_nxt == (_Hash_node_base *)0x0;
        local_1d0 = 0;
        sStack_1c8.pi_ = (sp_counted_base *)0x0;
        local_1b0 = "m.get_column(i).is_empty()";
        local_1a8 = (_Base_ptr)0x1b32ad;
        local_178 = _S_red;
        local_180 = &PTR__lazy_ostream_001dd2e8;
        local_170 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_168 = (_Base_ptr)&local_1b0;
        local_1c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_1b8 = "";
        boost::test_tools::tt_detail::report_assertion
                  (local_1d8,
                   (_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&local_180,&local_1c0,0x255,1,0,0);
        boost::detail::shared_count::~shared_count(&sStack_1c8);
      }
      else {
        if (local_110[uVar6 % local_108] == (__node_base_ptr)0x0) {
LAB_0019d8d2:
          std::__throw_out_of_range("_Map_base::at");
        }
        p_Var2 = local_110[uVar6 % local_108]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        while (uVar5 != uVar1) {
          p_Var2 = p_Var2->_M_nxt;
          if ((p_Var2 == (_Hash_node_base *)0x0) ||
             (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_108 != uVar6 % local_108))
          goto LAB_0019d8d2;
        }
        get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,false>>>>
                  ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_false>_>_>_>
                    *)&local_180,
                   (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_false>_>_>
                    *)(p_Var2 + 2));
        test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,false>>>>
                  (pvVar3 + uVar6,
                   (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_false>_>_>_>
                    *)&local_180);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&local_180);
      }
      uVar6 = (ulong)(uVar5 + 1);
      uVar4 = ((long)local_1f0.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1f0.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
  }
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_false>_>
  ::~Matrix((Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_false>_>
             *)local_150);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_1f0);
  return;
}

Assistant:

void test_boundary_access() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(orderedBoundaries, 5);

  for (unsigned int i = 0; i < orderedBoundaries.size(); ++i) {
    if constexpr (is_RU<Matrix>()) {
      if (i == 5) {
        BOOST_CHECK(m.get_column(i).is_empty());  // reduced
      } else {
        const auto& col = m.get_column(i);  // to force the const version
        test_column_equality<typename Matrix::Column>(orderedBoundaries[i], get_column_content_via_iterators(col));
      }
    } else {
      const auto& col = m.get_column(i);  // to force the const version
      test_column_equality<typename Matrix::Column>(orderedBoundaries[i], get_column_content_via_iterators(col));
    }
  }
}